

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChColor.cpp
# Opt level: O1

void __thiscall chrono::ChColor::ArchiveOUT(ChColor *this,ChArchiveOut *marchive)

{
  char *local_38;
  ChColor *local_30;
  undefined1 local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChColor>(marchive);
  local_38 = "R";
  local_28 = 0;
  local_30 = this;
  (*(marchive->super_ChArchive)._vptr_ChArchive[5])(marchive,&local_38);
  local_30 = (ChColor *)&this->G;
  local_38 = "G";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[5])(marchive,&local_38);
  local_30 = (ChColor *)&this->B;
  local_38 = "B";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[5])(marchive,&local_38);
  return;
}

Assistant:

void ChColor::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChColor>();

    // serialize all member data:
    marchive << CHNVP(R);
    marchive << CHNVP(G);
    marchive << CHNVP(B);
}